

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O1

bool WriteSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  int iVar1;
  int def_cyls;
  int def_heads;
  exception *this;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> supercardpro;
  shared_ptr<SCPDevDisk> scp_dev_disk;
  _Head_base<0UL,_SuperCardPro_*,_false> local_60;
  SCPDevDisk *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  util::lowercase((string *)&local_48,path);
  iVar1 = std::__cxx11::string::compare(local_48._M_pod_data);
  if ((code **)local_48._M_unused._0_8_ != &local_38) {
    operator_delete(local_48._M_unused._M_object,(ulong)(local_38 + 1));
  }
  if (iVar1 == 0) {
    SuperCardPro::Open();
    if (local_60._M_head_impl == (SuperCardPro *)0x0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58 = (SCPDevDisk *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SCPDevDisk,std::allocator<SCPDevDisk>,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              (&local_50,&local_58,(allocator<SCPDevDisk> *)&local_48,
               (unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&local_60);
    def_cyls = Disk::cyls((Disk *)local_58);
    def_heads = Disk::heads((Disk *)local_58);
    ValidateRange(&opt.range,0x80,2,1,def_cyls,def_heads);
    pcStack_30 = std::
                 _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
               ::_M_manager;
    local_48._M_unused._M_object = disk;
    local_48._8_8_ = &local_58;
    Range::each(&opt.range,(function<void_(const_CylHead_&)> *)&local_48,false);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
    if (local_60._M_head_impl != (SuperCardPro *)0x0) {
      (*(local_60._M_head_impl)->_vptr_SuperCardPro[1])();
    }
  }
  return iVar1 == 0;
}

Assistant:

bool WriteSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    ValidateRange(opt.range, MAX_TRACKS, MAX_SIDES, 1, scp_dev_disk->cyls(), scp_dev_disk->heads());

    opt.range.each([&](const CylHead& cylhead)
        {
            auto trackdata = disk->read(cylhead);
            Message(msgStatus, "Writing %s", CH(cylhead.cyl, cylhead.head));
            scp_dev_disk->write(std::move(trackdata));
        });

    return true;
}